

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void loadExt(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  char *local_40;
  char *zErrMsg;
  sqlite3 *db;
  char *zProc;
  char *zFile;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int argc_local;
  sqlite3_context *context_local;
  
  zFile = (char *)argv;
  argv_local._4_4_ = argc;
  psStack_10 = context;
  zProc = (char *)sqlite3_value_text(*argv);
  zErrMsg = (char *)sqlite3_context_db_handle(psStack_10);
  local_40 = (char *)0x0;
  if ((((sqlite3 *)zErrMsg)->flags & 0x800000U) == 0) {
    sqlite3_result_error(psStack_10,"not authorized",-1);
  }
  else {
    if (argv_local._4_4_ == 2) {
      db = (sqlite3 *)sqlite3_value_text(*(sqlite3_value **)(zFile + 8));
    }
    else {
      db = (sqlite3 *)0x0;
    }
    if (zProc != (char *)0x0) {
      iVar1 = sqlite3_load_extension((sqlite3 *)zErrMsg,zProc,(char *)db,&local_40);
      if (iVar1 != 0) {
        sqlite3_result_error(psStack_10,local_40,-1);
        sqlite3_free(local_40);
      }
    }
  }
  return;
}

Assistant:

static void loadExt(sqlite3_context *context, int argc, sqlite3_value **argv){
  const char *zFile = (const char *)sqlite3_value_text(argv[0]);
  const char *zProc;
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zErrMsg = 0;

  /* Disallow the load_extension() SQL function unless the SQLITE_LoadExtFunc
  ** flag is set.  See the sqlite3_enable_load_extension() API.
  */
  if( (db->flags & SQLITE_LoadExtFunc)==0 ){
    sqlite3_result_error(context, "not authorized", -1);
    return;
  }

  if( argc==2 ){
    zProc = (const char *)sqlite3_value_text(argv[1]);
  }else{
    zProc = 0;
  }
  if( zFile && sqlite3_load_extension(db, zFile, zProc, &zErrMsg) ){
    sqlite3_result_error(context, zErrMsg, -1);
    sqlite3_free(zErrMsg);
  }
}